

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void AYUVToVURow_C(uint8_t *src_ayuv,int src_stride_ayuv,uint8_t *dst_vu,int width)

{
  long lVar1;
  
  for (lVar1 = 0; (int)lVar1 < width; lVar1 = lVar1 + 2) {
    dst_vu[lVar1] =
         (uint8_t)((uint)src_ayuv[lVar1 * 4 + (long)(src_stride_ayuv + 4)] +
                   (uint)src_ayuv[lVar1 * 4 + (long)src_stride_ayuv] +
                   (uint)src_ayuv[lVar1 * 4 + 4] + (uint)src_ayuv[lVar1 * 4] + 2 >> 2);
    dst_vu[lVar1 + 1] =
         (uint8_t)((uint)src_ayuv[lVar1 * 4 + (long)(src_stride_ayuv + 5)] +
                   (uint)src_ayuv[lVar1 * 4 + (long)(src_stride_ayuv + 1)] +
                   (uint)src_ayuv[lVar1 * 4 + 5] + (uint)src_ayuv[lVar1 * 4 + 1] + 2 >> 2);
  }
  if ((width & 1U) != 0) {
    dst_vu[lVar1] =
         (uint8_t)(((uint)src_ayuv[(long)src_stride_ayuv + lVar1 * 4] + (uint)src_ayuv[lVar1 * 4]) *
                   2 + 2 >> 2);
    dst_vu[lVar1 + 1] =
         (uint8_t)(((uint)src_ayuv[(long)(src_stride_ayuv + 1) + lVar1 * 4] +
                   (uint)src_ayuv[lVar1 * 4 + 1]) * 2 + 2 >> 2);
  }
  return;
}

Assistant:

void AYUVToVURow_C(const uint8_t* src_ayuv,
                   int src_stride_ayuv,
                   uint8_t* dst_vu,
                   int width) {
  // Output a row of VU values, filtering 2x2 rows of AYUV.
  int x;
  for (x = 0; x < width; x += 2) {
    dst_vu[0] = (src_ayuv[0] + src_ayuv[4] + src_ayuv[src_stride_ayuv + 0] +
                 src_ayuv[src_stride_ayuv + 4] + 2) >>
                2;
    dst_vu[1] = (src_ayuv[1] + src_ayuv[5] + src_ayuv[src_stride_ayuv + 1] +
                 src_ayuv[src_stride_ayuv + 5] + 2) >>
                2;
    src_ayuv += 8;
    dst_vu += 2;
  }
  if (width & 1) {
    dst_vu[0] = (src_ayuv[0] + src_ayuv[0] + src_ayuv[src_stride_ayuv + 0] +
                 src_ayuv[src_stride_ayuv + 0] + 2) >>
                2;
    dst_vu[1] = (src_ayuv[1] + src_ayuv[1] + src_ayuv[src_stride_ayuv + 1] +
                 src_ayuv[src_stride_ayuv + 1] + 2) >>
                2;
  }
}